

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O0

int __thiscall
booster::locale::util::gregorian_calendar::get_diff
          (gregorian_calendar *this,period_mark p,int diff,gregorian_calendar *other)

{
  pointer pgVar1;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
  *in_RDI;
  unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
  self;
  long local_20;
  uint local_18;
  uint local_14;
  uint local_4;
  
  if (in_EDX == 0) {
    local_4 = 0;
  }
  else {
    local_20 = in_RCX;
    local_18 = in_EDX;
    local_14 = in_ESI;
    (*(code *)(((in_RDI->_M_t).
                super___uniq_ptr_impl<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
                ._M_t.
                super__Tuple_impl<0UL,_booster::locale::util::gregorian_calendar_*,_std::default_delete<booster::locale::util::gregorian_calendar>_>
                .super__Head_base<0UL,_booster::locale::util::gregorian_calendar_*,_false>.
               _M_head_impl)->super_abstract_calendar)._vptr_abstract_calendar)();
    std::
    unique_ptr<booster::locale::util::gregorian_calendar,std::default_delete<booster::locale::util::gregorian_calendar>>
    ::unique_ptr<std::default_delete<booster::locale::util::gregorian_calendar>,void>
              (in_RDI,(pointer)&stack0xffffffffffffffd8);
    pgVar1 = std::
             unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
             ::operator->((unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
                           *)0x2a69fb);
    (*(pgVar1->super_abstract_calendar)._vptr_abstract_calendar[8])
              (pgVar1,(ulong)local_14,0,(ulong)local_18);
    if ((int)local_18 < 1) {
      pgVar1 = std::
               unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
               ::operator->((unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
                             *)0x2a6a7e);
      if (pgVar1->time_ < *(long *)(local_20 + 0x10)) {
        local_4 = local_18 + 1;
      }
      else {
        local_4 = local_18;
      }
    }
    else {
      pgVar1 = std::
               unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
               ::operator->((unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
                             *)0x2a6a24);
      if (*(long *)(local_20 + 0x10) < pgVar1->time_) {
        local_4 = local_18 - 1;
      }
      else {
        local_4 = local_18;
      }
    }
    std::
    unique_ptr<booster::locale::util::gregorian_calendar,_std::default_delete<booster::locale::util::gregorian_calendar>_>
    ::~unique_ptr(in_RDI);
  }
  return local_4;
}

Assistant:

int get_diff(period::marks::period_mark p,int diff,gregorian_calendar const *other) const
            {
                if(diff == 0)
                    return 0;
                std::unique_ptr<gregorian_calendar> self(clone());
                self->adjust_value(p,move,diff);
                if(diff > 0){
                    if(self->time_ > other->time_)
                        return diff - 1;
                    else
                        return diff;
                }
                else {
                    if(self->time_ < other->time_)
                        return diff + 1;
                    else
                        return diff;
                }
             }